

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

void Gia_ManFromIfGetConfig
               (Vec_Int_t *vConfigs,If_Man_t *pIfMan,If_Cut_t *pCutBest,int iLit,
               Vec_Str_t *vConfigsStr)

{
  If_DsdMan_t *p;
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int c;
  uint uVar6;
  uint uVar7;
  word *pwVar8;
  char *pcVar9;
  int *piVar10;
  If_Obj_t *pIVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  int Lit;
  int iVar15;
  uint uVar17;
  bool bVar18;
  int local_60;
  ulong uVar16;
  
  p = pIfMan->pIfDsdMan;
  iVar1 = If_CutDsdLit(pIfMan,pCutBest);
  pwVar8 = If_DsdManGetFuncConfig(p,iVar1);
  pcVar9 = If_CutDsdPerm(pIfMan,pCutBest);
  uVar2 = If_DsdManVarNum(pIfMan->pIfDsdMan);
  iVar1 = If_DsdManTtBitNum(pIfMan->pIfDsdMan);
  iVar3 = If_DsdManPermBitNum(pIfMan->pIfDsdMan);
  iVar4 = Vec_IntEntry(vConfigs,1);
  iVar14 = 0;
  if (0 < iVar4) {
    iVar14 = iVar4;
  }
  while (bVar18 = iVar14 != 0, iVar14 = iVar14 + -1, bVar18) {
    Vec_IntPush(vConfigs,0);
  }
  uVar5 = iVar3 / (int)uVar2;
  piVar10 = Vec_IntEntryP(vConfigs,vConfigs->nSize - iVar4);
  if (iVar3 % (int)uVar2 != 0) {
    __assert_fail("nPermBitNum % nVarNum == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                  ,0x608,
                  "void Gia_ManFromIfGetConfig(Vec_Int_t *, If_Man_t *, If_Cut_t *, int, Vec_Str_t *)"
                 );
  }
  uVar12 = 0;
  iVar14 = 0;
  if (0 < iVar1) {
    iVar14 = iVar1;
  }
  for (; iVar14 != (int)uVar12; uVar12 = (ulong)((int)uVar12 + 1)) {
    if ((pwVar8[(uVar12 >> 6) + 1] >> (uVar12 & 0x3f) & 1) != 0) {
      *(ulong *)(piVar10 + (uVar12 >> 6) * 2) =
           *(ulong *)(piVar10 + (uVar12 >> 6) * 2) | 1L << ((byte)uVar12 & 0x3f);
    }
  }
  uVar12 = 0;
  uVar17 = 0;
  if (0 < (int)uVar5) {
    uVar17 = uVar5;
  }
  iVar15 = iVar1;
  uVar16 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar16 = uVar12;
  }
  while( true ) {
    if (uVar12 == uVar16) {
      uVar2 = iVar3 + iVar1;
      if (iVar4 * 0x20 <= (int)uVar2) {
        __assert_fail("nTtBitNum + nPermBitNum < 32 * nIntNum",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                      ,0x61f,
                      "void Gia_ManFromIfGetConfig(Vec_Int_t *, If_Man_t *, If_Cut_t *, int, Vec_Str_t *)"
                     );
      }
      iVar3 = If_CutDsdLit(pIfMan,pCutBest);
      uVar6 = Abc_LitIsCompl(iVar3);
      uVar13 = *(uint *)&pCutBest->field_0x1c;
      uVar7 = Abc_LitIsCompl(iLit);
      if ((uVar13 >> 0xc & 1 ^ uVar6) != uVar7) {
        *(ulong *)(piVar10 + (long)((int)uVar2 >> 6) * 2) =
             *(ulong *)(piVar10 + (long)((int)uVar2 >> 6) * 2) | 1L << ((byte)uVar2 & 0x3f);
      }
      uVar12 = 0;
      pcVar9 = (char *)0x0;
      Vec_IntAddToEntry(vConfigs,0,1);
      if (vConfigsStr == (Vec_Str_t *)0x0) {
        return;
      }
      uVar13 = Abc_Lit2Var(iLit);
      Vec_StrPrintF(vConfigsStr,pcVar9,(ulong)uVar13);
      Vec_StrPush(vConfigsStr,' ');
      for (; iVar14 != (int)uVar12; uVar12 = (ulong)((int)uVar12 + 1)) {
        Vec_StrPush(vConfigsStr,
                    ((*(ulong *)(piVar10 + (uVar12 >> 6) * 2) >> (uVar12 & 0x3f) & 1) != 0) + '0');
      }
      Vec_StrPush(vConfigsStr,' ');
      Vec_StrPush(vConfigsStr,' ');
      for (iVar14 = 0; local_60 = (int)uVar16, iVar14 != local_60; iVar14 = iVar14 + 1) {
        for (uVar13 = 0; uVar17 != uVar13; uVar13 = uVar13 + 1) {
          Vec_StrPush(vConfigsStr,
                      ((*(ulong *)(piVar10 + (long)((int)(iVar1 + uVar13) >> 6) * 2) >>
                        ((ulong)(iVar1 + uVar13) & 0x3f) & 1) != 0) + '0');
          if (uVar13 == 0) {
            Vec_StrPush(vConfigsStr,' ');
          }
        }
        Vec_StrPush(vConfigsStr,' ');
        Vec_StrPush(vConfigsStr,' ');
        iVar1 = iVar1 + uVar5;
      }
      Vec_StrPush(vConfigsStr,
                  ((*(ulong *)(piVar10 + (long)((int)uVar2 >> 6) * 2) >> ((ulong)uVar2 & 0x3f) & 1)
                  != 0) + '0');
      Vec_StrPush(vConfigsStr,'\n');
      return;
    }
    uVar2 = (uint)(*pwVar8 >> ((char)uVar12 * '\x04' & 0x3fU));
    if ((uint)(byte)pCutBest->field_0x1f <= (uVar2 & 0xf)) {
      __assert_fail("Var < (int)pCutBest->nLeaves",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                    ,0x612,
                    "void Gia_ManFromIfGetConfig(Vec_Int_t *, If_Man_t *, If_Cut_t *, int, Vec_Str_t *)"
                   );
    }
    Lit = (int)pcVar9[uVar2 & 0xf];
    uVar2 = Abc_Lit2Var(Lit);
    if ((byte)pCutBest->field_0x1f <= uVar2) break;
    uVar2 = Abc_Lit2Var(Lit);
    pIVar11 = If_ManObj(pIfMan,(int)(&pCutBest[1].Area)[uVar2]);
    c = Abc_LitIsCompl((pIVar11->field_22).iCopy);
    uVar2 = Abc_LitNotCond(Lit,c);
    for (uVar13 = 0; uVar17 != uVar13; uVar13 = uVar13 + 1) {
      if ((uVar2 >> (uVar13 & 0x1f) & 1) != 0) {
        *(ulong *)(piVar10 + (long)((int)(iVar15 + uVar13) >> 6) * 2) =
             *(ulong *)(piVar10 + (long)((int)(iVar15 + uVar13) >> 6) * 2) |
             1L << ((byte)(iVar15 + uVar13) & 0x3f);
      }
    }
    uVar12 = uVar12 + 1;
    iVar15 = iVar15 + uVar5;
  }
  __assert_fail("Abc_Lit2Var(Lit) < (int)pCutBest->nLeaves",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                ,0x615,
                "void Gia_ManFromIfGetConfig(Vec_Int_t *, If_Man_t *, If_Cut_t *, int, Vec_Str_t *)"
               );
}

Assistant:

void Gia_ManFromIfGetConfig( Vec_Int_t * vConfigs, If_Man_t * pIfMan, If_Cut_t * pCutBest, int iLit, Vec_Str_t * vConfigsStr )
{
    If_Obj_t * pIfObj = NULL;
    word * pPerm = If_DsdManGetFuncConfig( pIfMan->pIfDsdMan, If_CutDsdLit(pIfMan, pCutBest) ); // cell input -> DSD input
    char * pCutPerm = If_CutDsdPerm( pIfMan, pCutBest ); // DSD input -> cut input
    word * pArray;  int v, i, Lit, Var;
    int nVarNum = If_DsdManVarNum(pIfMan->pIfDsdMan);
    int nTtBitNum = If_DsdManTtBitNum(pIfMan->pIfDsdMan);
    int nPermBitNum = If_DsdManPermBitNum(pIfMan->pIfDsdMan);
    int nPermBitOne = nPermBitNum / nVarNum;
    // prepare storage
    int nIntNum = Vec_IntEntry( vConfigs, 1 );
    for ( i = 0; i < nIntNum; i++ )
        Vec_IntPush( vConfigs, 0 );
    pArray = (word *)Vec_IntEntryP( vConfigs, Vec_IntSize(vConfigs) - nIntNum );
    assert( nPermBitNum % nVarNum == 0 );
    // set truth table bits
    for ( i = 0; i < nTtBitNum; i++ )
        if ( Abc_TtGetBit(pPerm + 1, i) )
            Abc_TtSetBit( pArray, i );
    // set permutation bits
    for ( v = 0; v < nVarNum; v++ )
    {
        // get DSD variable
        Var = ((pPerm[0] >> (v * 4)) & 0xF);
        assert( Var < (int)pCutBest->nLeaves );
        // get AIG literal
        Lit = (int)pCutPerm[Var];
        assert( Abc_Lit2Var(Lit) < (int)pCutBest->nLeaves );
        // complement if polarity has changed
        pIfObj = If_ManObj( pIfMan, pCutBest->pLeaves[Abc_Lit2Var(Lit)] );
        Lit = Abc_LitNotCond( Lit, Abc_LitIsCompl(pIfObj->iCopy) );
        // create config literal
        for ( i = 0; i < nPermBitOne; i++ )
            if ( (Lit >> i) & 1 )
                Abc_TtSetBit( pArray, nTtBitNum + v * nPermBitOne + i );
    }
    // remember complementation
    assert( nTtBitNum + nPermBitNum < 32 * nIntNum );
    if ( Abc_LitIsCompl(If_CutDsdLit(pIfMan, pCutBest)) ^ pCutBest->fCompl ^ Abc_LitIsCompl(iLit) )
        Abc_TtSetBit( pArray, nTtBitNum + nPermBitNum );
    // update count
    Vec_IntAddToEntry( vConfigs, 0, 1 );
    // write configs
    if ( vConfigsStr )
    {
        Vec_StrPrintF( vConfigsStr, "%d", Abc_Lit2Var(iLit) );
        Vec_StrPush( vConfigsStr, ' ' );
        for ( i = 0; i < nTtBitNum; i++ )
            Vec_StrPush( vConfigsStr, (char)(Abc_TtGetBit(pArray, i) ? '1' : '0') );
        Vec_StrPush( vConfigsStr, ' ' );
        Vec_StrPush( vConfigsStr, ' ' );
        for ( v = 0; v < nVarNum; v++ )
        {
            for ( i = 0; i < nPermBitOne; i++ )
            {
                Vec_StrPush( vConfigsStr, (char)(Abc_TtGetBit(pArray, nTtBitNum + v * nPermBitOne + i) ? '1' : '0') );
                if ( i == 0 ) 
                    Vec_StrPush( vConfigsStr, ' ' );
            }
            Vec_StrPush( vConfigsStr, ' ' );
            Vec_StrPush( vConfigsStr, ' ' );
        }
        Vec_StrPush( vConfigsStr, (char)(Abc_TtGetBit(pArray, nTtBitNum + nPermBitNum) ? '1' : '0') );
        Vec_StrPush( vConfigsStr, '\n' );
    }
}